

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O3

void __thiscall
iu_MatcherFailure_x_iutest_x_EndsWith_Test::Body(iu_MatcherFailure_x_iutest_x_EndsWith_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestFlag TVar3;
  TestPartResultReporterInterface *pTVar4;
  TestFlag *pTVar5;
  Variable *pVVar6;
  AssertionResult *in_R8;
  ScopedSPITestFlag guard;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_spi_ar;
  AssertionResult iutest_ar;
  size_type __dnew;
  allocator<char> local_2b5;
  TestFlag local_2b4;
  string local_2b0;
  string local_290;
  SPIFailureChecker local_270;
  AssertionResult local_238;
  AssertionResult local_210;
  AssertionHelper local_1e8;
  undefined1 local_1b8 [8];
  size_type local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_270.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c1e8;
  local_270.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_2b4);
  local_1b8 = (undefined1  [8])&PTR__IMatcher_0023dc18;
  local_1b0 = 0x20663e;
  iutest::detail::EndsWithMatcher<char_const(&)[3]>::operator()
            (&local_210,(EndsWithMatcher<char_const(&)[3]> *)local_1b8,(char (*) [5])0x206582);
  if (local_210.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::PrintToString<char[5]>(&local_2b0,(char (*) [5])0x206582);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_290,(detail *)local_2b0._M_dataplus._M_p,"EndsWith(\"Ge\")",(char *)&local_210
               ,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,local_290._M_dataplus._M_p,&local_2b5);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x25f;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  paVar1 = &local_210.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    local_210.m_message.field_2._M_allocated_capacity + 1);
  }
  TVar3.m_test_flags = local_2b4.m_test_flags;
  pTVar5 = iutest::TestFlag::GetInstance();
  pTVar5->m_test_flags = TVar3.m_test_flags;
  local_1a8[0]._M_allocated_capacity._0_5_ = 0x5773646e45;
  local_1a8[0]._M_allocated_capacity._5_3_ = 0x687469;
  local_1a8[0]._8_4_ = 0x6547203a;
  local_1b0 = 0xc;
  local_1a8[0]._M_local_buf[0xc] = '\0';
  local_1b8 = (undefined1  [8])local_1a8;
  iutest::detail::SPIFailureChecker::GetResult(&local_238,&local_270,(string *)local_1b8);
  if (local_1b8 != (undefined1  [8])local_1a8) {
    operator_delete((void *)local_1b8,
                    CONCAT35(local_1a8[0]._M_allocated_capacity._5_3_,
                             (undefined5)local_1a8[0]._M_allocated_capacity) + 1);
  }
  local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c268;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar4 = local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0023c290;
  pVVar6 = iutest::TestEnv::get_vars();
  pVVar6->m_testpartresult_reporter = pTVar4;
  if (local_238.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,local_238.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_1e8);
    local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x2052c4;
    local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x10000025f;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_270,(Fixed *)local_1b8,false);
    if (local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_270.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  paVar2 = &local_238.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_238.m_message._M_dataplus._M_p,
                    local_238.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_270.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c1e8;
  local_270.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_2b4);
  local_1b8 = (undefined1  [8])&PTR__IMatcher_0023c300;
  local_1b0 = 0x20665a;
  iutest::detail::EndsWithMatcher<char_const(&)[4]>::operator()
            (&local_210,(EndsWithMatcher<char_const(&)[4]> *)local_1b8,(char (*) [5])0x206582);
  if (local_210.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::PrintToString<char[5]>(&local_2b0,(char (*) [5])0x206582);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_290,(detail *)local_2b0._M_dataplus._M_p,"EndsWith(\"gee\")",
               (char *)&local_210,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,local_290._M_dataplus._M_p,&local_2b5);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x260;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    local_210.m_message.field_2._M_allocated_capacity + 1);
  }
  TVar3.m_test_flags = local_2b4.m_test_flags;
  pTVar5 = iutest::TestFlag::GetInstance();
  pTVar5->m_test_flags = TVar3.m_test_flags;
  local_1a8[0]._M_allocated_capacity._0_5_ = 0x5773646e45;
  local_1a8[0]._M_allocated_capacity._5_3_ = 0x687469;
  local_1a8[0]._8_4_ = 0x6567203a;
  local_1a8[0]._M_local_buf[0xc] = 'e';
  local_1b0 = 0xd;
  local_1a8[0]._M_local_buf[0xd] = '\0';
  local_1b8 = (undefined1  [8])local_1a8;
  iutest::detail::SPIFailureChecker::GetResult(&local_238,&local_270,(string *)local_1b8);
  if (local_1b8 != (undefined1  [8])local_1a8) {
    operator_delete((void *)local_1b8,
                    CONCAT35(local_1a8[0]._M_allocated_capacity._5_3_,
                             (undefined5)local_1a8[0]._M_allocated_capacity) + 1);
  }
  local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c268;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar4 = local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0023c290;
  pVVar6 = iutest::TestEnv::get_vars();
  pVVar6->m_testpartresult_reporter = pTVar4;
  if (local_238.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,local_238.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_1e8);
    local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x2052c4;
    local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x100000260;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_270,(Fixed *)local_1b8,false);
    if (local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_270.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_238.m_message._M_dataplus._M_p,
                    local_238.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_270.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c1e8;
  local_270.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_2b4);
  local_1b8 = (undefined1  [8])&PTR__IMatcher_0023c340;
  local_1b0 = 0x206683;
  iutest::detail::EndsWithMatcher<char_const(&)[16]>::operator()
            (&local_210,(EndsWithMatcher<char_const(&)[16]> *)local_1b8,(char (*) [5])0x206582);
  if (local_210.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::PrintToString<char[5]>(&local_2b0,(char (*) [5])0x206582);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_290,(detail *)local_2b0._M_dataplus._M_p,"EndsWith(\"TooLongLongEnds\")",
               (char *)&local_210,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,local_290._M_dataplus._M_p,&local_2b5);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x261;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    local_210.m_message.field_2._M_allocated_capacity + 1);
  }
  pTVar5 = iutest::TestFlag::GetInstance();
  pTVar5->m_test_flags = local_2b4.m_test_flags;
  local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x19;
  local_1b8 = (undefined1  [8])local_1a8;
  local_1b8 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)&local_1e8)
  ;
  local_1a8[0]._M_allocated_capacity._0_5_ =
       SUB85(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,0);
  local_1a8[0]._M_allocated_capacity._5_3_ =
       (undefined3)
       ((ulong)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p >> 0x28);
  *(char *)((long)local_1b8 + 9) = ' ';
  *(char *)((long)local_1b8 + 10) = 'T';
  *(char *)((long)local_1b8 + 0xb) = 'o';
  *(char *)((long)local_1b8 + 0xc) = 'o';
  *(char *)((long)local_1b8 + 0xd) = 'L';
  *(char *)((long)local_1b8 + 0xe) = 'o';
  *(char *)((long)local_1b8 + 0xf) = 'n';
  *(char *)((long)local_1b8 + 0x10) = 'g';
  *(char *)((long)local_1b8 + 0x11) = 'L';
  *(char *)((long)local_1b8 + 0x12) = 'o';
  *(char *)((long)local_1b8 + 0x13) = 'n';
  *(char *)((long)local_1b8 + 0x14) = 'g';
  *(char *)((long)local_1b8 + 0x15) = 'E';
  *(char *)((long)local_1b8 + 0x16) = 'n';
  *(char *)((long)local_1b8 + 0x17) = 'd';
  *(char *)((long)local_1b8 + 0x18) = 's';
  *(undefined8 *)local_1b8 = 0x6874695773646e45;
  *(char *)((long)local_1b8 + 8) = ':';
  *(char *)((long)local_1b8 + 9) = ' ';
  *(char *)((long)local_1b8 + 10) = 'T';
  *(char *)((long)local_1b8 + 0xb) = 'o';
  *(char *)((long)local_1b8 + 0xc) = 'o';
  *(char *)((long)local_1b8 + 0xd) = 'L';
  *(char *)((long)local_1b8 + 0xe) = 'o';
  *(char *)((long)local_1b8 + 0xf) = 'n';
  local_1b0 = (size_type)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)((long)local_1b8 +
           (long)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_238,&local_270,(string *)local_1b8);
  if (local_1b8 != (undefined1  [8])local_1a8) {
    operator_delete((void *)local_1b8,
                    CONCAT35(local_1a8[0]._M_allocated_capacity._5_3_,
                             (undefined5)local_1a8[0]._M_allocated_capacity) + 1);
  }
  local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c268;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar4 = local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0023c290;
  pVVar6 = iutest::TestEnv::get_vars();
  pVVar6->m_testpartresult_reporter = pTVar4;
  if (local_238.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,local_238.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_1e8);
    local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x2052c4;
    local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x100000261;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_270,(Fixed *)local_1b8,false);
    if (local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_270.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_270.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_238.m_message._M_dataplus._M_p,
                    local_238.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(MatcherFailure, EndsWith)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT("hoge", EndsWith("Ge")) , "EndsWith: Ge" );
    CHECK_FAILURE( IUTEST_ASSERT_THAT("hoge", EndsWith("gee")), "EndsWith: gee" );
    CHECK_FAILURE( IUTEST_ASSERT_THAT("hoge", EndsWith("TooLongLongEnds")) , "EndsWith: TooLongLongEnds" );
}